

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O0

Flow * __thiscall
wasm::ModuleRunnerBase<wasm::ModuleRunner>::visitStore
          (Flow *__return_storage_ptr__,ModuleRunnerBase<wasm::ModuleRunner> *this,Store *curr)

{
  Name memory;
  undefined1 this_00 [8];
  char *pcVar1;
  bool bVar2;
  ExpressionRunner<wasm::ModuleRunner> *pEVar3;
  Address memorySize_00;
  Literal *pLVar4;
  ExternalInterface *pEVar5;
  Literal local_160;
  address64_t local_148;
  address64_t local_140;
  address64_t local_138;
  address64_t local_130;
  Literal local_128;
  Address local_110;
  Address addr;
  Address memorySize;
  undefined1 local_d8 [8];
  MemoryInstanceInfo info;
  Flow value;
  undefined1 local_68 [8];
  Flow ptr;
  Store *curr_local;
  ModuleRunnerBase<wasm::ModuleRunner> *this_local;
  
  ptr.breakTo.super_IString.str._M_str = (char *)curr;
  pEVar3 = (ExpressionRunner<wasm::ModuleRunner> *)self(this);
  ExpressionRunner<wasm::ModuleRunner>::visit
            ((Flow *)local_68,pEVar3,*(Expression **)(ptr.breakTo.super_IString.str._M_str + 0x30));
  bVar2 = Flow::breaking((Flow *)local_68);
  if (bVar2) {
    Flow::Flow(__return_storage_ptr__,(Flow *)local_68);
  }
  else {
    pEVar3 = (ExpressionRunner<wasm::ModuleRunner> *)self(this);
    ExpressionRunner<wasm::ModuleRunner>::visit
              ((Flow *)&info.name.super_IString.str._M_str,pEVar3,
               *(Expression **)(ptr.breakTo.super_IString.str._M_str + 0x38));
    bVar2 = Flow::breaking((Flow *)&info.name.super_IString.str._M_str);
    if (bVar2) {
      Flow::Flow(__return_storage_ptr__,(Flow *)&info.name.super_IString.str._M_str);
    }
    else {
      getMemoryInstanceInfo
                ((MemoryInstanceInfo *)local_d8,this,
                 (Name)((IString *)(ptr.breakTo.super_IString.str._M_str + 0x48))->str);
      memory.super_IString.str._M_len._4_4_ = info.instance._4_4_;
      memory.super_IString.str._M_len._0_4_ = info.instance._0_4_;
      memory.super_IString.str._M_str._4_4_ = info.name.super_IString.str._M_len._4_4_;
      memory.super_IString.str._M_str._0_4_ = (undefined4)info.name.super_IString.str._M_len;
      memorySize_00 = getMemorySize((ModuleRunnerBase<wasm::ModuleRunner> *)local_d8,memory);
      pcVar1 = ptr.breakTo.super_IString.str._M_str;
      this_00 = local_d8;
      pLVar4 = Flow::getSingleValue((Flow *)local_68);
      ::wasm::Literal::Literal(&local_128,pLVar4);
      local_130 = memorySize_00.addr;
      local_110 = getFinalAddress<wasm::Store>
                            ((ModuleRunnerBase<wasm::ModuleRunner> *)this_00,(Store *)pcVar1,
                             &local_128,memorySize_00);
      ::wasm::Literal::~Literal(&local_128);
      if ((ptr.breakTo.super_IString.str._M_str[0x28] & 1U) != 0) {
        local_138 = local_110.addr;
        local_140 = memorySize_00.addr;
        checkAtomicAddress((ModuleRunnerBase<wasm::ModuleRunner> *)local_d8,local_110,
                           (uint)(byte)ptr.breakTo.super_IString.str._M_str[0x10],memorySize_00);
      }
      pEVar5 = MemoryInstanceInfo::interface((MemoryInstanceInfo *)local_d8);
      pcVar1 = ptr.breakTo.super_IString.str._M_str;
      local_148 = local_110.addr;
      pLVar4 = Flow::getSingleValue((Flow *)&info.name.super_IString.str._M_str);
      ::wasm::Literal::Literal(&local_160,pLVar4);
      (*pEVar5->_vptr_ExternalInterface[0xc])
                (pEVar5,pcVar1,local_148,&local_160,
                 CONCAT44(info.instance._4_4_,info.instance._0_4_),
                 CONCAT44(info.name.super_IString.str._M_len._4_4_,
                          (undefined4)info.name.super_IString.str._M_len));
      ::wasm::Literal::~Literal(&local_160);
      Flow::Flow(__return_storage_ptr__);
    }
    Flow::~Flow((Flow *)&info.name.super_IString.str._M_str);
  }
  Flow::~Flow((Flow *)local_68);
  return __return_storage_ptr__;
}

Assistant:

Flow visitStore(Store* curr) {
    NOTE_ENTER("Store");
    Flow ptr = self()->visit(curr->ptr);
    if (ptr.breaking()) {
      return ptr;
    }
    Flow value = self()->visit(curr->value);
    if (value.breaking()) {
      return value;
    }
    auto info = getMemoryInstanceInfo(curr->memory);
    auto memorySize = info.instance->getMemorySize(info.name);
    auto addr =
      info.instance->getFinalAddress(curr, ptr.getSingleValue(), memorySize);
    if (curr->isAtomic) {
      info.instance->checkAtomicAddress(addr, curr->bytes, memorySize);
    }
    NOTE_EVAL1(addr);
    NOTE_EVAL1(value);
    info.interface()->store(curr, addr, value.getSingleValue(), info.name);
    return Flow();
  }